

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOListener.cpp
# Opt level: O2

void __thiscall mognetwork::TcpASIOListener::run(TcpASIOListener *this)

{
  list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
  *plVar1;
  int iVar2;
  SocketFD SVar3;
  Status SVar4;
  TcpSocket *this_00;
  _List_node_base *p_Var5;
  char *pcVar6;
  ostream *poVar7;
  _List_node_base *this_01;
  list<int,_std::allocator<int>_> triggeredList;
  _List_base<int,_std::allocator<int>_> local_48;
  
  plVar1 = &this->m_listeners;
  do {
    if (this->m_running != true) {
      poVar7 = (ostream *)&std::cout;
      pcVar6 = "Listener Thread stopped.";
LAB_0010d7a4:
      poVar7 = std::operator<<(poVar7,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar7);
      return;
    }
    Selector::waitForTrigger(&this->m_selector);
    if ((this->m_selector).m_state == Error) {
      poVar7 = (ostream *)&std::cerr;
      pcVar6 = "Select error on listening thread.";
      goto LAB_0010d7a4;
    }
    this_01 = (_List_node_base *)&local_48;
    std::__cxx11::list<int,_std::allocator<int>_>::list
              ((list<int,_std::allocator<int>_> *)this_01,&(this->m_selector).m_readUpdated);
    while (this_01 = (((_List_base<int,_std::allocator<int>_> *)&this_01->_M_next)->_M_impl)._M_node
                     .super__List_node_base._M_next, this_01 != (_List_node_base *)&local_48) {
      iVar2 = *(int *)&this_01[1]._M_next;
      SVar3 = Socket::getSocketFD((Socket *)this->m_serverSocket);
      if (iVar2 == SVar3) {
        Mutex::lock(this->m_mutex);
        acceptClient(this);
        Mutex::unlock(this->m_mutex);
      }
      else if (*(int *)&this_01[1]._M_next != this->m_pipefd[0]) {
        Mutex::lock(this->m_mutex);
        this_00 = TcpASIOServer::getSocketByFd(this->m_server,*(SocketFD *)&this_01[1]._M_next);
        TcpSocket::setServer(this_00,this->m_server);
        SVar4 = TcpSocket::readPendingDatas(this_00);
        if (SVar4 != Waiting) {
          p_Var5 = (_List_node_base *)plVar1;
          if (SVar4 == Ok) {
            while (p_Var5 = (((_List_base<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                               *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                  p_Var5 != (_List_node_base *)plVar1) {
              (**(code **)(*(long *)p_Var5[1]._M_next + 0x18))(p_Var5[1]._M_next,this_00);
            }
          }
          else {
            while (p_Var5 = (((_List_base<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                               *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                  p_Var5 != (_List_node_base *)plVar1) {
              (**(code **)(*(long *)p_Var5[1]._M_next + 0x20))(p_Var5[1]._M_next,this_00);
            }
            Selector::remFdToRead(&this->m_selector,*(SocketFD *)&this_01[1]._M_next);
            TcpASIOServer::remSocket(this->m_server,*(SocketFD *)&this_01[1]._M_next);
          }
        }
        Mutex::unlock(this->m_mutex);
      }
    }
    std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear(&local_48);
  } while( true );
}

Assistant:

void TcpASIOListener::run()
  {
    while (m_running)
      {
	m_selector.waitForTrigger();
	if (m_selector.getState() == Selector::Error)
	  {
	    std::cerr << "Select error on listening thread." << std::endl;
	    return ;
	}
	std::list<SocketFD> triggeredList = m_selector.getReadingTriggeredSockets();
	for (std::list<SocketFD>::iterator it = triggeredList.begin(); it != triggeredList.end(); ++it)
	  {
	    if (*it == m_serverSocket.getSocketFD())
	      {
		m_mutex->lock();
		// NEW CLIENT TO ACCEPT
		acceptClient();
		m_mutex->unlock();
	      }
	    else if (*it != m_pipefd[0])
	      {
		m_mutex->lock();
		TcpSocket* socket = m_server->getSocketByFd(*it);
		socket->setServer(m_server);
		Socket::Status status = socket->readPendingDatas();
		if (status == Socket::Ok)
		  {
		    // DATAS FULLY RECEIVED.
		    for (std::list<ITcpASIOListenerHandler*>::iterator it2 = m_listeners.begin();
			 it2 != m_listeners.end(); ++it2)
		      (*it2)->onReceivedData(*socket);
		  }
		else if (status != Socket::Waiting)
		  {
		    // DISCONNECTED
		    for (std::list<ITcpASIOListenerHandler*>::iterator it2 = m_listeners.begin();
			 it2 != m_listeners.end(); ++it2)
		      (*it2)->onDisconnect(*socket);
		    m_selector.remFdToRead(*it);
		    m_server->remSocket(*it);
		  }
		m_mutex->unlock();
	      }
	  }
      }
    std::cout << "Listener Thread stopped." << std::endl;
  }